

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc8.cpp
# Opt level: O3

void __thiscall Crc8::DisplayTable(Crc8 *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  
  iVar2 = 0;
  do {
    lVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      lVar3 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) | 0x4000;
      *(uint *)(std::ios_base::Init::Init + *(long *)(lVar3 + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(lVar3 + -0x18)) & 0xffffffb5 | 8;
      lVar1 = *(long *)(lVar3 + -0x18);
      if (*(char *)(lVar1 + 0x10a181) == '\0') {
        std::ios::widen((char)lVar1 + -0x60);
        *(undefined1 *)(lVar1 + 0x10a181) = 1;
        lVar3 = std::cout;
      }
      *(undefined1 *)(lVar1 + 0x10a180) = 0x30;
      *(undefined8 *)(__cxa_rethrow + *(long *)(lVar3 + -0x18)) = 2;
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,(uint)*(byte *)((long)this + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    iVar2 = iVar2 + 1;
    this = (Crc8 *)((long)this + 0x10);
  } while (iVar2 != 0x10);
  return;
}

Assistant:

void Crc8::DisplayTable() const
{
  int index = 0;

  for (int i = 0; i < 16; ++i)
  {
    for (int j = 0; j < 16; ++j)
    {
      std::cout << "0x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2) << int(crcTable[index++]) << ", ";
    }

    std::cout << "\n";
  }
}